

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>&,kj::None_const&>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>_&,_const_kj::None_&>
          *params)

{
  char *pcVar1;
  size_t sVar2;
  undefined4 in_register_0000000c;
  String argValues [1];
  char **ppcVar3;
  undefined8 uVar4;
  char *local_88;
  size_t sStack_80;
  ArrayDisposer *pAStack_78;
  char **local_68;
  undefined8 uStack_60;
  StringPtr local_58;
  char *local_48;
  undefined8 local_40;
  String local_38;
  
  this->exception = (Exception *)0x0;
  local_48 = "(can\'t stringify)";
  local_40 = 0x12;
  local_58.content.ptr = "(can\'t stringify)";
  local_58.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_38,(_ *)&local_48,(StringPtr *)(CONCAT44(in_register_0000000c,code) + 0x10),
             &local_58,(StringPtr *)condition);
  ppcVar3 = &local_88;
  local_88 = local_38.content.ptr;
  sStack_80 = local_38.content.size_;
  pAStack_78 = local_38.content.disposer;
  uStack_60 = 1;
  uVar4 = 1;
  local_68 = ppcVar3;
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
      );
  sVar2 = sStack_80;
  pcVar1 = local_88;
  if (local_88 != (char *)0x0) {
    local_88 = (char *)0x0;
    sStack_80 = 0;
    (**pAStack_78->_vptr_ArrayDisposer)(pAStack_78,pcVar1,1,sVar2,sVar2,0,ppcVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}